

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::BilinearPatch::Intersect(BilinearPatch *this,Ray *ray,Float tMax)

{
  undefined1 auVar1 [16];
  bool bVar2;
  optional<pbrt::ShapeIntersection> *this_00;
  optional<pbrt::ShapeIntersection> *in_RDI;
  undefined8 uVar3;
  Vector3<float> VVar4;
  SurfaceInteraction intr;
  optional<pbrt::BilinearIntersection> blpIsect;
  Point3f *p11;
  Point3f *p01;
  Point3f *p10;
  Point3f *p00;
  int *v;
  BilinearPatchMesh *mesh;
  Vector3f *in_stack_000007c0;
  Float in_stack_000007cc;
  Point2f *in_stack_000007d0;
  int in_stack_000007dc;
  BilinearPatchMesh *in_stack_000007e0;
  SurfaceInteraction *in_stack_fffffffffffffd08;
  ShapeIntersection *v_00;
  SurfaceInteraction *in_stack_fffffffffffffd10;
  undefined1 local_190 [32];
  float local_170;
  Point3f *in_stack_ffffffffffffff80;
  Point3f *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Point3f *in_stack_ffffffffffffff98;
  optional local_60 [4];
  Float in_stack_ffffffffffffffa4;
  Ray *in_stack_ffffffffffffffa8;
  
  GetMesh((BilinearPatch *)0x4b8907);
  IntersectBilinearPatch
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
             (Point3f *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  bVar2 = pstd::optional::operator_cast_to_bool(local_60);
  if (bVar2) {
    pstd::optional<pbrt::BilinearIntersection>::operator->
              ((optional<pbrt::BilinearIntersection> *)0x4b8aa8);
    uVar3 = 0;
    VVar4 = Tuple3<pbrt::Vector3,_float>::operator-
                      ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffffd10);
    local_190._16_4_ = VVar4.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar1._8_8_ = uVar3;
    auVar1._0_8_ = VVar4.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    local_190._8_8_ = vmovlpd_avx(auVar1);
    local_190._24_8_ = local_190._8_8_;
    local_170 = (float)local_190._16_4_;
    InteractionFromIntersection
              (in_stack_000007e0,in_stack_000007dc,in_stack_000007d0,in_stack_000007cc,
               in_stack_000007c0);
    SurfaceInteraction::SurfaceInteraction(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    v_00 = (ShapeIntersection *)local_190;
    this_00 = (optional<pbrt::ShapeIntersection> *)
              pstd::optional<pbrt::BilinearIntersection>::operator->
                        ((optional<pbrt::BilinearIntersection> *)0x4b8b77);
    (v_00->intr).super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low =
         *(Float *)((long)&this_00->optionalValue + 8);
    pstd::optional<pbrt::ShapeIntersection>::optional(this_00,v_00);
  }
  else {
    memset(in_RDI,0,0x108);
    pstd::optional<pbrt::ShapeIntersection>::optional(in_RDI);
  }
  pstd::optional<pbrt::BilinearIntersection>::~optional
            ((optional<pbrt::BilinearIntersection> *)0x4b8bb9);
  return in_RDI;
}

Assistant:

pstd::optional<ShapeIntersection> BilinearPatch::Intersect(const Ray &ray,
                                                           Float tMax) const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    pstd::optional<BilinearIntersection> blpIsect =
        IntersectBilinearPatch(ray, tMax, p00, p10, p01, p11);
    if (!blpIsect)
        return {};
    SurfaceInteraction intr =
        InteractionFromIntersection(mesh, blpIndex, blpIsect->uv, ray.time, -ray.d);
    return ShapeIntersection{intr, blpIsect->t};
}